

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
~AlexDataNode(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *this)

{
  (this->super_AlexNode<int,_int>)._vptr_AlexNode = (_func_int **)&PTR__AlexDataNode_00113c38;
  if (this->key_slots_ != (int *)0x0) {
    operator_delete(this->key_slots_,(long)this->data_capacity_ << 2);
    operator_delete(this->payload_slots_,(long)this->data_capacity_ << 2);
    operator_delete(this->bitmap_,(long)this->bitmap_size_ << 3);
    return;
  }
  return;
}

Assistant:

~AlexDataNode() {
#if ALEX_DATA_NODE_SEP_ARRAYS
    if (key_slots_ == nullptr) {
      return;
    }
    key_allocator().deallocate(key_slots_, data_capacity_);
    payload_allocator().deallocate(payload_slots_, data_capacity_);
#else
    if (data_slots_ == nullptr) {
      return;
    }
    value_allocator().deallocate(data_slots_, data_capacity_);
#endif
    bitmap_allocator().deallocate(bitmap_, bitmap_size_);
  }